

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuObjIterFirst(sqlite3rbu *p,RbuObjIter *pIter)

{
  sqlite3 *db;
  int iVar1;
  char *pcVar2;
  int local_1c;
  int rc;
  RbuObjIter *pIter_local;
  sqlite3rbu *p_local;
  
  memset(pIter,0,0xa8);
  db = p->dbRbu;
  pcVar2 = "";
  if (p->zTarget == (char *)0x0) {
    pcVar2 = "AND rootpage!=0 AND rootpage IS NOT NULL";
  }
  pcVar2 = sqlite3_mprintf("SELECT rbu_target_name(name, type=\'view\') AS target, name FROM sqlite_master WHERE type IN (\'table\', \'view\') AND target IS NOT NULL  %s ORDER BY name"
                           ,pcVar2);
  local_1c = prepareFreeAndCollectError(db,&pIter->pTblIter,&p->zErrmsg,pcVar2);
  if (local_1c == 0) {
    local_1c = prepareAndCollectError
                         (p->dbMain,&pIter->pIdxIter,&p->zErrmsg,
                          "SELECT name, rootpage, sql IS NULL OR substr(8, 6)==\'UNIQUE\'   FROM main.sqlite_master   WHERE type=\'index\' AND tbl_name = ?"
                         );
  }
  pIter->bCleanup = 1;
  p->rc = local_1c;
  iVar1 = rbuObjIterNext(p,pIter);
  return iVar1;
}

Assistant:

static int rbuObjIterFirst(sqlite3rbu *p, RbuObjIter *pIter){
  int rc;
  memset(pIter, 0, sizeof(RbuObjIter));

  rc = prepareFreeAndCollectError(p->dbRbu, &pIter->pTblIter, &p->zErrmsg, 
    sqlite3_mprintf(
      "SELECT rbu_target_name(name, type='view') AS target, name "
      "FROM sqlite_master "
      "WHERE type IN ('table', 'view') AND target IS NOT NULL "
      " %s "
      "ORDER BY name"
  , rbuIsVacuum(p) ? "AND rootpage!=0 AND rootpage IS NOT NULL" : ""));

  if( rc==SQLITE_OK ){
    rc = prepareAndCollectError(p->dbMain, &pIter->pIdxIter, &p->zErrmsg,
        "SELECT name, rootpage, sql IS NULL OR substr(8, 6)=='UNIQUE' "
        "  FROM main.sqlite_master "
        "  WHERE type='index' AND tbl_name = ?"
    );
  }

  pIter->bCleanup = 1;
  p->rc = rc;
  return rbuObjIterNext(p, pIter);
}